

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O3

ulong BN_div_word(BIGNUM *a,ulong w)

{
  ulong l;
  int iVar1;
  int iVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong d;
  
  uVar4 = 0xffffffffffffffff;
  if (w != 0) {
    if (a->top == 0) {
      uVar4 = 0;
    }
    else {
      iVar1 = BN_num_bits_word(w);
      d = w << (-(char)iVar1 & 0x3fU);
      iVar2 = BN_lshift(a,a,0x40 - iVar1);
      if (iVar2 != 0) {
        if ((long)a->top < 1) {
          uVar4 = 0;
        }
        else {
          puVar3 = a->d;
          uVar5 = (long)a->top + 1;
          uVar4 = 0;
          do {
            l = puVar3[uVar5 - 2];
            uVar4 = bn_div_words(uVar4,l,d);
            puVar3 = a->d;
            puVar3[uVar5 - 2] = uVar4;
            uVar4 = l - uVar4 * d;
            uVar5 = uVar5 - 1;
          } while (1 < uVar5);
          iVar2 = a->top;
          if ((0 < (long)iVar2) && (a->d[(long)iVar2 + -1] == 0)) {
            a->top = iVar2 + -1;
          }
        }
        uVar4 = uVar4 >> ((byte)(0x40 - iVar1) & 0x3f);
      }
    }
  }
  return uVar4;
}

Assistant:

BN_ULONG BN_div_word(BIGNUM *a, BN_ULONG w)
{
    BN_ULONG ret = 0;
    int i, j;

    bn_check_top(a);
    w &= BN_MASK2;

    if (!w)
        /* actually this an error (division by zero) */
        return (BN_ULONG)-1;
    if (a->top == 0)
        return 0;

    /* normalize input (so bn_div_words doesn't complain) */
    j = BN_BITS2 - BN_num_bits_word(w);
    w <<= j;
    if (!BN_lshift(a, a, j))
        return (BN_ULONG)-1;

    for (i = a->top - 1; i >= 0; i--) {
        BN_ULONG l, d;

        l = a->d[i];
        d = bn_div_words(ret, l, w);
        ret = (l - ((d * w) & BN_MASK2)) & BN_MASK2;
        a->d[i] = d;
    }
    if ((a->top > 0) && (a->d[a->top - 1] == 0))
        a->top--;
    ret >>= j;
    bn_check_top(a);
    return (ret);
}